

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::AddSucc(BasicBlock *this,FlowEdge *edge,FlowGraph *graph)

{
  FlowEdge *local_10;
  FlowEdge *edge_local;
  
  local_10 = edge;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&(this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>,
             &graph->alloc->super_ArenaAllocator,&local_10);
  return;
}

Assistant:

void
BasicBlock::AddSucc(FlowEdge * edge, FlowGraph * graph)
{
    this->succList.Prepend(graph->alloc, edge);
}